

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_rename_file_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int err;
  sexp_conflict local_40;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 9)) {
      iVar1 = rename((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),
                     (char *)(*(long *)(in_R8 + 2) + 0x10 + *(long *)(in_R8 + 4)));
      if (iVar1 == 0) {
        local_40 = (sexp_conflict)0x13e;
      }
      else {
        local_40 = (sexp_conflict)0x3e;
      }
      local_8 = local_40;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_rename_file_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg1))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg1);
  err = rename(sexp_string_data(arg0), sexp_string_data(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}